

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

token * preproc_find_else(Source_File *src,Translation_Data *translation_data,char jump_before)

{
  int local_9c;
  undefined1 local_98 [4];
  int indentation;
  Source_File temp_src;
  token *hold_token;
  char jump_before_local;
  Translation_Data *translation_data_local;
  Source_File *src_local;
  
  local_9c = 1;
  memcpy(local_98,src,0x68);
  do {
    if (src->src[src->where_in_src] == '\0' || local_9c == 0) {
      if (jump_before != '\0') {
        memcpy(src,local_98,0x68);
      }
      return (token *)0x0;
    }
    memcpy(local_98,src,0x68);
    temp_src._96_8_ = get_next_token(src,chonky,'\x01');
    if (((token *)temp_src._96_8_)->type == KW_HASHTAG) {
      free((void *)temp_src._96_8_);
      temp_src._96_8_ = get_next_token(src,chonky_jr,'\0');
      switch(((token *)temp_src._96_8_)->type) {
      case PKW_IF:
      case PKW_IFDEF:
      case PKW_IFNDEF:
        local_9c = local_9c + 1;
        break;
      case PKW_ELIF:
      case PKW_ELSE:
        if (local_9c == 1) {
          if (jump_before != '\0') {
            memcpy(src,local_98,0x68);
          }
          return (token *)temp_src._96_8_;
        }
        break;
      case PKW_ENDIF:
        local_9c = local_9c + -1;
        break;
      case PKW_NOTYPE:
        free((void *)temp_src._96_8_);
        goto_new_line(src,translation_data);
        return (token *)0x0;
      }
      free((void *)temp_src._96_8_);
    }
    else {
      if (((token *)temp_src._96_8_)->type == KW_NOTYPE) {
        if (src->where_in_src != src->src_size) {
          push_lexing_error("unexpected character",src,translation_data);
        }
        free((void *)temp_src._96_8_);
        return (token *)0x0;
      }
      free((void *)temp_src._96_8_);
    }
    goto_new_line(src,translation_data);
  } while( true );
}

Assistant:

struct token* preproc_find_else(struct Source_File *src,struct Translation_Data *translation_data,char jump_before)
{
	struct token *hold_token;
	struct Source_File temp_src;
	int indentation=1;

		temp_src=*src;
	while(src->src[src->where_in_src]!='\0' && indentation)
	{
		/*BEWARE*/
		temp_src=*src;
		/*END BEWARE*/

		hold_token=get_next_token(src,&chonky[0],1);
		if(hold_token->type==KW_HASHTAG)
		{
			free(hold_token);
			hold_token=get_next_token(src,&chonky_jr[0],0);
			switch(hold_token->type)
			{
				case PKW_IF:
				case PKW_IFDEF:
				case PKW_IFNDEF:
					++indentation;
					break;

				case PKW_ENDIF:
					--indentation;
					break;

				case PKW_ELSE:
				case PKW_ELIF:
					if(indentation==1)
					{
						if(jump_before)
							*src=temp_src;
						return hold_token;
					}
					else
					{
						break;
					}
				case PKW_NOTYPE:
					free(hold_token);
					goto_new_line(src,translation_data);
					return NULL;
			}
			free(hold_token);

		}else if(hold_token->type!=KW_NOTYPE)
		{
			free(hold_token);
		}else
		{
			if(src->where_in_src!=src->src_size)
				push_lexing_error("unexpected character",src,translation_data);
			free(hold_token);
			return NULL;
		}
		goto_new_line(src,translation_data);
	}
	/*BEWARE*/
	//goto_new_line(src,translation_data);	
	/*END BEWARE*/
	if(jump_before)
		*src=temp_src;
	return NULL;
}